

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O1

NormalizationResult * __thiscall
Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>
          (NormalizationResult *__return_storage_ptr__,Kernel *this,TermList t,
          NormalizationResult *ts,bool *simplified)

{
  Symbol *this_00;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_PolynomialNormalizer_cpp:339:19),_Kernel::PolyNf>_>
  it;
  anon_class_16_2_400f5052 func;
  uint uVar1;
  TermList *pTVar2;
  bool bVar3;
  Interpretation IVar4;
  uint uVar5;
  ulong uVar6;
  uint *rhs_00;
  OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *other;
  FuncId FVar7;
  anon_class_1_0_00000001 singletonProduct;
  NormalizationResult rhs;
  FuncId fn;
  Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  res;
  Term *in_stack_fffffffffffffe80;
  NormalizationResult **in_stack_fffffffffffffe88;
  OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_168;
  FuncId local_130;
  Variable local_11c;
  Stack<Kernel::PolyNf> local_118;
  RationalConstantType local_f8;
  Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> local_d8;
  char local_c8;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  local_c4;
  FuncTerm local_90;
  PolyNf local_60;
  PolyNf local_48;
  
  if (((ulong)this & 1) != 0) {
    Variable::Variable(&local_11c,(uint)((ulong)this >> 2));
    PolyNf::PolyNf(&local_48,local_11c);
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(__return_storage_ptr__,(anon_class_1_0_00000001 *)&stack0xfffffffffffffe8f,&local_48)
    ;
    return __return_storage_ptr__;
  }
  func.simplified = (bool *)t._content;
  func.ts = in_stack_fffffffffffffe88;
  NumTraits<Kernel::RationalConstantType>::
  ifLinMul<Kernel::normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::TermList,Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,bool&)::_lambda(auto:1&,auto:2)_1_>
            (in_stack_fffffffffffffe80,func);
  if (local_c8 == '\x01') {
    ::Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
    ::DefaultImpl(&__return_storage_ptr__->_inner,&local_c4);
    goto LAB_005a7d14;
  }
  this_00 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)*(uint *)(this + 8) * 8);
  bVar3 = Signature::Symbol::numeralConstant(this_00,(RationalConstantType *)0x0);
  if (bVar3) {
    IntegerConstantType::IntegerConstantType(&local_f8._num,(IntegerConstantType *)(this_00 + 1));
    IntegerConstantType::IntegerConstantType
              (&local_f8._den,(IntegerConstantType *)&this_00[1]._name.field_2);
    wrapNumeral<Kernel::RationalConstantType>(__return_storage_ptr__,&local_f8);
    mpz_clear(local_f8._den._val);
    mpz_clear((__mpz_struct *)&local_f8);
    goto LAB_005a7d14;
  }
  FVar7 = FuncId::symbolOf((Term *)this);
  local_130._typeArgs = FVar7._typeArgs;
  local_130._num = FVar7._num;
  bVar3 = FuncId::isInterpreted(&local_130);
  if (!bVar3) {
LAB_005a7e6d:
    pTVar2 = local_130._typeArgs;
    uVar1 = local_130._num;
    uVar5 = FuncId::numTermArguments(&local_130);
    local_168._elem._elem._12_8_ = 0;
    local_168._elem._elem._20_4_ = uVar5;
    local_118._capacity = 0;
    local_118._stack = (PolyNf *)0x0;
    local_118._cursor = (PolyNf *)0x0;
    local_118._end = (PolyNf *)0x0;
    it._iter._inner._func.a =
         (Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
          **)&stack0xfffffffffffffe90;
    it._iter._0_8_ = local_168._0_8_;
    it._iter._inner._inner._next = 0;
    it._iter._inner._inner._from = 0;
    it._iter._inner._16_8_ = local_168._elem._elem._20_8_;
    local_168._elem._elem._4_8_ = &stack0xfffffffffffffe90;
    ::Lib::Stack<Kernel::PolyNf>::
    loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*,unsigned_int>(Lib::Coproduct<Kernel::PolyNf,Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>*&,unsigned_int)::_lambda(auto:1)_1___ConstantType>>,Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>>>&)_1_,Kernel::PolyNf>>>
              (&local_118,it);
    FVar7._4_4_ = 0;
    FVar7._num = uVar1;
    FVar7._typeArgs = pTVar2;
    FuncTerm::FuncTerm(&local_90,FVar7,&local_118);
    ::Lib::perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>((Lib *)&local_d8,&local_90);
    PolyNf::PolyNf(&local_60,&local_d8);
    normalizeNumSort<Kernel::NumTraits<Kernel::RationalConstantType>_>::anon_class_1_0_00000001::
    operator()(__return_storage_ptr__,(anon_class_1_0_00000001 *)&stack0xfffffffffffffe8f,&local_60)
    ;
    if (local_90._args._stack != (PolyNf *)0x0) {
      uVar6 = local_90._args._capacity * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_90._args._stack;
      }
      else if (uVar6 < 0x11) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_90._args._stack;
      }
      else if (uVar6 < 0x19) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_90._args._stack;
      }
      else if (uVar6 < 0x21) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_90._args._stack;
      }
      else if (uVar6 < 0x31) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_90._args._stack;
      }
      else if (uVar6 < 0x41) {
        *(undefined8 *)
         &((local_90._args._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_90._args._stack;
      }
      else {
        operator_delete(local_90._args._stack,0x10);
      }
    }
    if (local_118._stack != (PolyNf *)0x0) {
      uVar6 = local_118._capacity * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_118._stack;
      }
      else if (uVar6 < 0x11) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_118._stack;
      }
      else if (uVar6 < 0x19) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_118._stack;
      }
      else if (uVar6 < 0x21) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_118._stack;
      }
      else if (uVar6 < 0x31) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_118._stack;
      }
      else if (uVar6 < 0x41) {
        *(undefined8 *)
         &((local_118._stack)->super_PolyNfSuper)._inner.
          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
          .
          super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_118._stack;
      }
      else {
        operator_delete(local_118._stack,0x10);
      }
    }
    goto LAB_005a7d14;
  }
  IVar4 = FuncId::interpretation(&local_130);
  rhs_00 = &switchD_005a7d84::switchdataD_0091c39c;
  switch(IVar4) {
  case RAT_UNARY_MINUS:
    normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
              (__return_storage_ptr__,(Kernel *)t._content,ts,
               (bool *)&switchD_005a7d84::switchdataD_0091c39c);
    break;
  case RAT_PLUS:
    normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
              (__return_storage_ptr__,(Kernel *)t._content,
               (NormalizationResult *)(t._content + 0x34),
               (NormalizationResult *)&switchD_005a7d84::switchdataD_0091c39c);
    break;
  case RAT_MINUS:
    normalizeMinus<Kernel::NumTraits<Kernel::RationalConstantType>>
              ((NormalizationResult *)&local_168,(Kernel *)(t._content + 0x34),ts,
               (bool *)&switchD_005a7d84::switchdataD_0091c39c);
    normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
              (__return_storage_ptr__,(Kernel *)t._content,(NormalizationResult *)&local_168,
               (NormalizationResult *)rhs_00);
    other = &local_168;
    goto LAB_005a7dc8;
  case RAT_MULTIPLY:
    normalizeMul<Kernel::NumTraits<Kernel::RationalConstantType>>
              (__return_storage_ptr__,(Kernel *)t._content,
               (NormalizationResult *)(t._content + 0x34),ts,simplified);
    break;
  default:
    IVar4 = FuncId::interpretation(&local_130);
    if (IVar4 == RAT_QUOTIENT) {
      normalizeDiv<Kernel::NumTraits<Kernel::RationalConstantType>>
                ((Option<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  *)&local_168,(Kernel *)t._content,(NormalizationResult *)(t._content + 0x34),ts,
                 simplified);
    }
    else {
      local_168._elem._elem._28_8_ = 0;
      local_168._elem._elem._36_8_ = 0;
      local_168._elem._elem._12_8_ = 0;
      local_168._elem._elem._20_8_ = 0;
      local_168._0_8_ = 0;
      local_168._elem._elem._4_8_ = (undefined1 *)0x0;
      local_168._elem._elem._44_8_ = 0;
    }
    if (local_168._isSome != true) goto LAB_005a7e6d;
    other = (OptionBase<Lib::Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             *)&local_168._elem;
    ::Lib::CoproductImpl::TrivialOperations::MoveCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
    ::DefaultImpl(&__return_storage_ptr__->_inner,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                   *)other);
    if (local_168._isSome != true) break;
LAB_005a7dc8:
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                    *)other);
  }
LAB_005a7d14:
  if (local_c8 == '\x01') {
    ::Lib::CoproductImpl::TrivialOperations::Destr::
    DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ::~DefaultImpl(&local_c4.
                    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  );
  }
  return __return_storage_ptr__;
}

Assistant:

NormalizationResult normalizeNumSort(TermList t, NormalizationResult* ts, bool& simplified)
{
  using Polynom      = Polynom<NumTraits>;
  using PreMonom     = PreMonom    <NumTraits>;

  auto singletonProduct = [](PolyNf t) -> NormalizationResult {
    return NormalizationResult(PreMonom({t}));
  };

  if (t.isVar()) {
    return singletonProduct(PolyNf(Variable(t.var())));

  } else {
    auto term = t.term();
    auto res = NumTraits::ifLinMul(term, [&](auto& n, auto t) -> NormalizationResult {
        auto& inner = ts[0];
        ASS(inner.is<Polynom>() || inner.is<PreMonom>())
        if (inner.is<Polynom>()) {
          return NormalizationResult(
              PreMonom(n, {RenderPolyNf{}(std::move(*inner.template as<Polynom>()))}));
        } else {
          if (inner.as<PreMonom>()->numeral != 1 && n != 1) {
            simplified = true;
          }
          inner.as<PreMonom>()->numeral *= n;
          return std::move(inner);
        }
    });
    if (res) return std::move(*res);
    if (auto n = NumTraits::tryNumeral(term)) {
      return wrapNumeral(*n);
    }
    auto fn = FuncId::symbolOf(term);
    if (fn.isInterpreted()) {
      switch(fn.interpretation()) {
        case NumTraits::mulI:
          ASS(ts != nullptr);
          return normalizeMul<NumTraits>(ts[0], ts[1], simplified);
        case NumTraits::addI:
          ASS(ts != nullptr);
          return normalizeAdd<NumTraits>(ts[0], ts[1]);
        case NumTraits::binMinusI:{
          ASS(ts != nullptr);
          auto rhs = normalizeMinus<NumTraits>(ts[1], simplified);
          return normalizeAdd<NumTraits>(ts[0], rhs);
        }
        case NumTraits::minusI:
          ASS(ts != nullptr);
          return normalizeMinus<NumTraits>(ts[0], simplified);
        default:
        {
          auto out = normalizeSpecialized<NumTraits>(fn.interpretation(), ts, simplified);
          if (out.isSome()) {
            return std::move(out.unwrap());
          }
        }
      }
    }

    return singletonProduct(PolyNf(perfect(FuncTerm(
        fn, 
        Stack<PolyNf>::fromIterator(
            arrayIter(ts, fn.numTermArguments())
            .map( [](NormalizationResult& r) -> PolyNf { return std::move(r).apply(RenderPolyNf{}); }))
      )
    )));
  }
}